

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_iter.c
# Opt level: O3

int tnt_iter_map_next(tnt_iter *i)

{
  byte bVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  byte *pbVar5;
  byte *pbVar6;
  long lVar7;
  char **ppcVar8;
  int64_t iVar9;
  
  uVar3 = (i->data).map.cur_index + 1;
  (i->data).map.cur_index = uVar3;
  if (uVar3 < (i->data).map.pair_count) {
    pbVar6 = *(byte **)((long)&i->data + (ulong)(uVar3 != 0) * 0x20 + 8);
    (i->data).array.elem = (char *)pbVar6;
    ppcVar8 = &(i->data).array.elem_end;
    iVar9 = 1;
    do {
      bVar1 = *pbVar6;
      pbVar5 = pbVar6 + 1;
      *ppcVar8 = (char *)pbVar5;
      lVar7 = (long)""[bVar1];
      if (lVar7 < 0) {
        if (bVar1 == 0xd9) {
          pbVar5 = pbVar6 + (ulong)pbVar6[1] + 2;
          goto LAB_00107c40;
        }
        if ((byte)""[bVar1] < 0xe1) {
          *ppcVar8 = (char *)pbVar6;
          mp_next_slowpath(ppcVar8,iVar9);
          pbVar5 = (byte *)*ppcVar8;
          break;
        }
        iVar9 = iVar9 - lVar7;
      }
      else {
        pbVar5 = pbVar5 + lVar7;
LAB_00107c40:
        *ppcVar8 = (char *)pbVar5;
      }
      bVar2 = 1 < iVar9;
      pbVar6 = pbVar5;
      iVar9 = iVar9 + -1;
    } while (bVar2);
    (i->data).map.value = (char *)pbVar5;
    ppcVar8 = &(i->data).map.value_end;
    iVar9 = 1;
    do {
      bVar1 = *pbVar5;
      pbVar6 = pbVar5 + 1;
      *ppcVar8 = (char *)pbVar6;
      lVar7 = (long)""[bVar1];
      if (lVar7 < 0) {
        if (bVar1 == 0xd9) {
          pbVar5 = pbVar5 + (ulong)pbVar5[1] + 2;
          goto LAB_00107caf;
        }
        if ((byte)""[bVar1] < 0xe1) {
          *ppcVar8 = (char *)pbVar5;
          mp_next_slowpath(ppcVar8,iVar9);
          break;
        }
        iVar9 = iVar9 - lVar7;
        pbVar5 = pbVar6;
      }
      else {
        pbVar5 = pbVar6 + lVar7;
LAB_00107caf:
        *ppcVar8 = (char *)pbVar5;
      }
      bVar2 = 1 < iVar9;
      iVar9 = iVar9 + -1;
    } while (bVar2);
    iVar4 = 1;
  }
  else {
    i->status = TNT_ITER_FAIL;
    iVar4 = 0;
  }
  return iVar4;
}

Assistant:

static int tnt_iter_map_next(struct tnt_iter *i) {
	struct tnt_iter_map *itr = TNT_IMAP(i);
	itr->cur_index++;
	if ((uint32_t)itr->cur_index >= itr->pair_count) {
		i->status = TNT_ITER_FAIL;
		return 0;
	}
	if (itr->cur_index == 0)
		itr->key = itr->first_key;
	else
		itr->key = itr->value_end;
	itr->key_end = itr->key;
	mp_next(&itr->key_end);
	itr->value = itr->key_end;
	itr->value_end = itr->value;
	mp_next(&itr->value_end);
	return 1;

}